

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_string.cpp
# Opt level: O0

size_t __thiscall pstore::indirect_string::length(indirect_string *this)

{
  database *db;
  address local_30;
  database_reader local_28;
  indirect_string *local_18;
  indirect_string *this_local;
  
  local_18 = this;
  if ((this->is_pointer_ & 1U) == 0) {
    if (((this->field_2).address_ & 1) == 0) {
      db = this->db_;
      address::address(&local_30,(this->field_2).address_);
      local_28 = serialize::archive::make_reader(db,local_30);
      this_local = (indirect_string *)
                   serialize::string_helper::
                   read_length<pstore::serialize::archive::database_reader>(&local_28);
    }
    else {
      this_local = (indirect_string *)
                   sstring_view<const_char_*>::length
                             ((sstring_view<const_char_*> *)
                              ((this->field_2).address_ & 0xfffffffffffffffe));
    }
  }
  else {
    this_local = (indirect_string *)sstring_view<const_char_*>::length((this->field_2).str_);
  }
  return (size_t)this_local;
}

Assistant:

std::size_t indirect_string::length () const {
        if (is_pointer_) {
            return str_->length ();
        }
        if (address_ & in_heap_mask) {
            return reinterpret_cast<sstring_view<char const *> const *> (address_ & ~in_heap_mask)
                ->length ();
        }
        return serialize::string_helper::read_length (
            serialize::archive::make_reader (db_, address{address_}));
    }